

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QLatin1StringView propertyNameForStandardPixmap(StandardPixmap sp)

{
  ulong size;
  uint in_EDI;
  undefined4 in_stack_ffffffffffffffe8;
  QLatin1StringView local_10;
  
  size = (ulong)in_EDI;
  switch(size) {
  case 0:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 1:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 2:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 3:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 4:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 5:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 6:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 7:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 8:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 9:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 10:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0xb:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0xc:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0xd:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0xe:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0xf:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x10:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x11:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x12:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x13:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x14:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x15:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x16:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x17:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  default:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x19:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x1a:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x1d:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x1e:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x1f:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x20:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x21:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x22:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x23:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x24:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x25:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x26:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x27:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x28:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x29:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x2a:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x2b:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x2c:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x2d:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x2e:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x2f:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x30:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x31:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x32:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x33:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x34:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x35:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x36:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x37:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x38:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
    break;
  case 0x46:
    local_10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),size);
  }
  return local_10;
}

Assistant:

static QLatin1StringView propertyNameForStandardPixmap(QStyle::StandardPixmap sp)
{
    switch (sp) {
        case QStyle::SP_TitleBarMenuButton: return "titlebar-menu-icon"_L1;
        case QStyle::SP_TitleBarMinButton: return "titlebar-minimize-icon"_L1;
        case QStyle::SP_TitleBarMaxButton: return "titlebar-maximize-icon"_L1;
        case QStyle::SP_TitleBarCloseButton: return "titlebar-close-icon"_L1;
        case QStyle::SP_TitleBarNormalButton: return "titlebar-normal-icon"_L1;
        case QStyle::SP_TitleBarShadeButton: return "titlebar-shade-icon"_L1;
        case QStyle::SP_TitleBarUnshadeButton: return "titlebar-unshade-icon"_L1;
        case QStyle::SP_TitleBarContextHelpButton: return "titlebar-contexthelp-icon"_L1;
        case QStyle::SP_DockWidgetCloseButton: return "dockwidget-close-icon"_L1;
        case QStyle::SP_MessageBoxInformation: return "messagebox-information-icon"_L1;
        case QStyle::SP_MessageBoxWarning: return "messagebox-warning-icon"_L1;
        case QStyle::SP_MessageBoxCritical: return "messagebox-critical-icon"_L1;
        case QStyle::SP_MessageBoxQuestion: return "messagebox-question-icon"_L1;
        case QStyle::SP_DesktopIcon: return "desktop-icon"_L1;
        case QStyle::SP_TrashIcon: return "trash-icon"_L1;
        case QStyle::SP_ComputerIcon: return "computer-icon"_L1;
        case QStyle::SP_DriveFDIcon: return "floppy-icon"_L1;
        case QStyle::SP_DriveHDIcon: return "harddisk-icon"_L1;
        case QStyle::SP_DriveCDIcon: return "cd-icon"_L1;
        case QStyle::SP_DriveDVDIcon: return "dvd-icon"_L1;
        case QStyle::SP_DriveNetIcon: return "network-icon"_L1;
        case QStyle::SP_DirOpenIcon: return "directory-open-icon"_L1;
        case QStyle::SP_DirClosedIcon: return "directory-closed-icon"_L1;
        case QStyle::SP_DirLinkIcon: return "directory-link-icon"_L1;
        case QStyle::SP_FileIcon: return "file-icon"_L1;
        case QStyle::SP_FileLinkIcon: return "file-link-icon"_L1;
        case QStyle::SP_FileDialogStart: return "filedialog-start-icon"_L1;
        case QStyle::SP_FileDialogEnd: return "filedialog-end-icon"_L1;
        case QStyle::SP_FileDialogToParent: return "filedialog-parent-directory-icon"_L1;
        case QStyle::SP_FileDialogNewFolder: return "filedialog-new-directory-icon"_L1;
        case QStyle::SP_FileDialogDetailedView: return "filedialog-detailedview-icon"_L1;
        case QStyle::SP_FileDialogInfoView: return "filedialog-infoview-icon"_L1;
        case QStyle::SP_FileDialogContentsView: return "filedialog-contentsview-icon"_L1;
        case QStyle::SP_FileDialogListView: return "filedialog-listview-icon"_L1;
        case QStyle::SP_FileDialogBack: return "filedialog-backward-icon"_L1;
        case QStyle::SP_DirIcon: return "directory-icon"_L1;
        case QStyle::SP_DialogOkButton: return "dialog-ok-icon"_L1;
        case QStyle::SP_DialogCancelButton: return "dialog-cancel-icon"_L1;
        case QStyle::SP_DialogHelpButton: return "dialog-help-icon"_L1;
        case QStyle::SP_DialogOpenButton: return "dialog-open-icon"_L1;
        case QStyle::SP_DialogSaveButton: return "dialog-save-icon"_L1;
        case QStyle::SP_DialogCloseButton: return "dialog-close-icon"_L1;
        case QStyle::SP_DialogApplyButton: return "dialog-apply-icon"_L1;
        case QStyle::SP_DialogResetButton: return "dialog-reset-icon"_L1;
        case QStyle::SP_DialogDiscardButton: return "dialog-discard-icon"_L1;
        case QStyle::SP_DialogYesButton: return "dialog-yes-icon"_L1;
        case QStyle::SP_DialogNoButton: return "dialog-no-icon"_L1;
        case QStyle::SP_ArrowUp: return "uparrow-icon"_L1;
        case QStyle::SP_ArrowDown: return "downarrow-icon"_L1;
        case QStyle::SP_ArrowLeft: return "leftarrow-icon"_L1;
        case QStyle::SP_ArrowRight: return "rightarrow-icon"_L1;
        case QStyle::SP_ArrowBack: return "backward-icon"_L1;
        case QStyle::SP_ArrowForward: return "forward-icon"_L1;
        case QStyle::SP_DirHomeIcon: return "home-icon"_L1;
        case QStyle::SP_LineEditClearButton: return "lineedit-clear-button-icon"_L1;
        default: return ""_L1;
    }
}